

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O1

void __thiscall Ptex::v2_2::PtexSeparableKernel::downresV(PtexSeparableKernel *this)

{
  int8_t *piVar1;
  uint uVar2;
  uint uVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  int iVar7;
  
  pfVar4 = this->kv;
  uVar2 = this->v;
  pfVar5 = pfVar4;
  if ((uVar2 & 1) != 0) {
    pfVar5 = pfVar4 + 1;
    this->vw = this->vw + -1;
  }
  uVar3 = this->vw;
  pfVar6 = pfVar5;
  if (1 < (int)uVar3) {
    iVar7 = (uVar3 >> 1) + 1;
    do {
      *pfVar5 = *pfVar6 + pfVar6[1];
      pfVar5 = pfVar5 + 1;
      pfVar6 = pfVar6 + 2;
      iVar7 = iVar7 + -1;
    } while (1 < iVar7);
  }
  if ((uVar3 & 1) != 0) {
    *pfVar5 = *pfVar6;
    pfVar5 = pfVar5 + 1;
  }
  this->v = (int)uVar2 / 2;
  this->vw = (int)((ulong)((long)pfVar5 - (long)pfVar4) >> 2);
  piVar1 = &(this->res).vlog2;
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void downresV()
    {
        float* src = kv;
        float* dst = kv;

        // skip odd leading sample (if any)
        if (v & 1) {
            dst++;
            src++;
            vw--;
        }

        // combine even pairs
        for (int i = vw/2; i > 0; i--) {
            *dst++ = src[0] + src[1];
            src += 2;
        }

        // copy odd trailing sample (if any)
        if (vw & 1) {
            *dst++ = *src++;
        }

        // update state
        v /= 2;
        vw = int(dst - kv);
        res.vlog2--;
    }